

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RWNode.h
# Opt level: O2

bool __thiscall dg::dda::RWNode::isDynAlloc(RWNode *this)

{
  RWCalledValue *cv;
  void *pvVar1;
  bool bVar2;
  
  if (this->type == DYN_ALLOC) {
    bVar2 = true;
  }
  else {
    if (this->type != CALL) {
      return false;
    }
    pvVar1 = *(void **)&this[1].super_SubgraphNode<dg::dda::RWNode>;
    while ((bVar2 = pvVar1 != this[1].super_SubgraphNode<dg::dda::RWNode>.data, bVar2 &&
           ((*(long *)((long)pvVar1 + 8) == 0 || (*(int *)(*(long *)((long)pvVar1 + 8) + 0x90) != 2)
            )))) {
      pvVar1 = (void *)((long)pvVar1 + 0x10);
    }
  }
  return bVar2;
}

Assistant:

RWNodeType getType() const { return type; }